

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString>
               (JavascriptString *s,void *packedSubstringInfo,void *packedSubstringInfo2,
               CharCount appendCharLength,CompoundString *toString)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  code *pcVar4;
  bool bVar5;
  charcount_t cVar6;
  CharCount CVar7;
  undefined4 *puVar8;
  char16 *pcVar9;
  JavascriptString *pJVar10;
  uint uVar11;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b7,"(s)","s");
    if (!bVar5) goto LAB_00b2bb53;
    *puVar8 = 0;
  }
  if (packedSubstringInfo == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b8,"(packedSubstringInfo)","packedSubstringInfo");
    if (!bVar5) goto LAB_00b2bb53;
    *puVar8 = 0;
  }
  cVar6 = JavascriptString::GetLength(s);
  if (cVar6 < appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b9,"(appendCharLength <= s->GetLength())",
                                "appendCharLength <= s->GetLength()");
    if (!bVar5) goto LAB_00b2bb53;
    *puVar8 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ba,"(toString)","toString");
    if (!bVar5) goto LAB_00b2bb53;
    *puVar8 = 0;
  }
  pcVar9 = JavascriptString::UnsafeGetBuffer((JavascriptString *)toString);
  if (pcVar9 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3bb,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar5) goto LAB_00b2bb53;
    *puVar8 = 0;
  }
  if (toString->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3bc,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar5) goto LAB_00b2bb53;
    *puVar8 = 0;
  }
  if (toString->directCharLength == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3bd,"(!toString->HasOnlyDirectChars())",
                                "!toString->HasOnlyDirectChars()");
    if (!bVar5) {
LAB_00b2bb53:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  CVar7 = Block::PointerLengthFromCharLength((toString->lastBlockInfo).charLength);
  iVar1 = -(uint)(packedSubstringInfo2 == (void *)0x0) + 2;
  uVar11 = ((toString->lastBlockInfo).charCapacity >> 2) - iVar1;
  if (CVar7 < uVar11) {
    pvVar3 = (toString->lastBlockInfo).buffer.ptr;
    pJVar10 = GetImmutableOrScriptUnreferencedString(s);
    pcVar2 = (char *)((long)pvVar3 + (ulong)CVar7 * 8);
    Memory::Recycler::WBSetBit(pcVar2);
    *(JavascriptString **)pcVar2 = pJVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
    if (packedSubstringInfo2 != (void *)0x0) {
      Memory::Recycler::WBSetBit(pcVar2 + 8);
      *(void **)(pcVar2 + 8) = packedSubstringInfo2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2 + 8);
    }
    pcVar2 = (char *)((long)pvVar3 + (ulong)(iVar1 + CVar7) * 8);
    Memory::Recycler::WBSetBit(pcVar2);
    *(void **)pcVar2 = packedSubstringInfo;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
    cVar6 = JavascriptString::GetLength((JavascriptString *)toString);
    JavascriptString::SetLength((JavascriptString *)toString,appendCharLength + cVar6);
    BlockInfo::SetPointerLength
              (&toString->lastBlockInfo,-(uint)(packedSubstringInfo2 == (void *)0x0) + 3 + CVar7);
  }
  return CVar7 < uVar11;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(
        JavascriptString *const s,
        void *const packedSubstringInfo,
        void *const packedSubstringInfo2,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(packedSubstringInfo);
        Assert(appendCharLength <= s->GetLength());
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!toString->HasOnlyDirectChars());

        const CharCount blockPointerLength = toString->LastBlockPointerLength();
        const CharCount appendPointerLength = 2 + !!packedSubstringInfo2;
        if(blockPointerLength < toString->LastBlockPointerCapacity() - (appendPointerLength - 1))
        {
            Field(void*)* pointers = toString->LastBlockPointers();
            pointers[blockPointerLength] = GetImmutableOrScriptUnreferencedString(s);
            if(packedSubstringInfo2)
                pointers[blockPointerLength + 1] = packedSubstringInfo2;
            pointers[blockPointerLength + (appendPointerLength - 1)] = packedSubstringInfo;
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockPointerLength(blockPointerLength + appendPointerLength);
            return true;
        }
        return false;
    }